

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void __thiscall
Json::BuiltStyledStreamWriter::writeCommentBeforeValue(BuiltStyledStreamWriter *this,Value *root)

{
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  _Var1;
  char *pcVar2;
  char local_41;
  char *local_40;
  long local_38;
  char local_30;
  undefined7 uStack_2f;
  
  if (((this->cs_ != None) &&
      (_Var1._M_head_impl =
            (root->comments_).ptr_._M_t.
            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl,
      _Var1._M_head_impl !=
      (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL> *
      )0x0)) && (*(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 8) != 0)) {
    if ((this->field_0xd8 & 2) == 0) {
      writeIndent(this);
    }
    _Var1._M_head_impl =
         (root->comments_).ptr_._M_t.
         super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
         .
         super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
         ._M_head_impl;
    local_40 = &local_30;
    if (_Var1._M_head_impl ==
        (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
         *)0x0) {
      local_38 = 0;
      local_30 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,*(long *)(_Var1._M_head_impl)->_M_elems,
                 *(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 8) +
                 *(long *)(_Var1._M_head_impl)->_M_elems);
    }
    if (local_38 != 0) {
      pcVar2 = local_40;
      do {
        local_41 = *pcVar2;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->super_StreamWriter).sout_,&local_41,1);
        if (((*pcVar2 == '\n') && (pcVar2 + 1 != local_40 + local_38)) && (pcVar2[1] == '/')) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((this->super_StreamWriter).sout_,(this->indentString_)._M_dataplus._M_p,
                     (this->indentString_)._M_string_length);
        }
        pcVar2 = pcVar2 + 1;
      } while (pcVar2 != local_40 + local_38);
    }
    this->field_0xd8 = this->field_0xd8 & 0xfd;
    if (local_40 != &local_30) {
      operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
    }
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeCommentBeforeValue(Value const& root) {
  if (cs_ == CommentStyle::None)
    return;
  if (!root.hasComment(commentBefore))
    return;

  if (!indented_)
    writeIndent();
  const String& comment = root.getComment(commentBefore);
  String::const_iterator iter = comment.begin();
  while (iter != comment.end()) {
    *sout_ << *iter;
    if (*iter == '\n' && ((iter + 1) != comment.end() && *(iter + 1) == '/'))
      // writeIndent();  // would write extra newline
      *sout_ << indentString_;
    ++iter;
  }
  indented_ = false;
}